

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_rand.cpp
# Opt level: O3

int __thiscall
ON_RandomNumberGenerator::RandomSignedInteger(ON_RandomNumberGenerator *this,int i0,int i1)

{
  ON__UINT32 OVar1;
  int iVar2;
  int iVar3;
  
  OVar1 = on_random_number(&this->m_rand_context);
  iVar2 = i0 - i1;
  if (i0 < i1) {
    i1 = i0;
  }
  iVar3 = -iVar2;
  if (0 < iVar2) {
    iVar3 = iVar2;
  }
  return i1 + OVar1 % (iVar3 + 1U);
}

Assistant:

int ON_RandomNumberGenerator::RandomSignedInteger(int i0, int i1)
{
  const ON__UINT32 r = RandomNumber();
  const ON__UINT32 delta = (i0 < i1) ? ((unsigned)(i1 - i0)) : ((unsigned)(i0 - i1));
  return
    (0xFFFFFFFFU == delta)
    ? ((int)r) // avoid delta+1 overflow and crash
    : (((i0 < i1) ? i0 : i1) + ((int)(r % (delta + 1U))))
    ;
}